

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O0

uint32_t helper_neon_sqadd_u16_aarch64(CPUARMState_conflict *env,uint32_t a,uint32_t b)

{
  int32_t iVar1;
  uint32_t uVar2;
  uint32_t local_24;
  uint32_t r;
  int32_t vr;
  int32_t vb;
  int32_t va;
  uint32_t b_local;
  uint32_t a_local;
  CPUARMState_conflict *env_local;
  
  local_24 = extract32(a,0,0x10);
  iVar1 = sextract32(b,0,0x10);
  local_24 = local_24 + iVar1;
  if ((int)local_24 < 0x8000) {
    if ((int)local_24 < -0x8000) {
      (env->vfp).qc[0] = 1;
      local_24 = 0xffff8000;
    }
  }
  else {
    (env->vfp).qc[0] = 1;
    local_24 = 0x7fff;
  }
  uVar2 = deposit32(0,0,0x10,local_24);
  local_24 = extract32(a,0x10,0x10);
  iVar1 = sextract32(b,0x10,0x10);
  local_24 = local_24 + iVar1;
  if ((int)local_24 < 0x8000) {
    if ((int)local_24 < -0x8000) {
      (env->vfp).qc[0] = 1;
      local_24 = 0xffff8000;
    }
  }
  else {
    (env->vfp).qc[0] = 1;
    local_24 = 0x7fff;
  }
  uVar2 = deposit32(uVar2,0x10,0x10,local_24);
  return uVar2;
}

Assistant:

uint32_t HELPER(neon_sqadd_u16)(CPUARMState *env, uint32_t a, uint32_t b)
{
    int32_t va, vb, vr;
    uint32_t r = 0;

    SSATACC(16, 0);
    SSATACC(16, 16);

    return r;
}